

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O3

int OPENSSL_strncasecmp(char *a,char *b,size_t n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  if (n == 0) {
    return 0;
  }
  lVar4 = 0;
  do {
    uVar2 = (uint)a[lVar4];
    uVar1 = uVar2 | 0x20;
    if (0x19 < uVar2 - 0x41) {
      uVar1 = uVar2;
    }
    uVar3 = (uint)b[lVar4];
    uVar2 = uVar3 | 0x20;
    if (0x19 < uVar3 - 0x41) {
      uVar2 = uVar3;
    }
    if ((int)uVar1 < (int)uVar2) {
      return -1;
    }
    if ((int)uVar2 < (int)uVar1) {
      return 1;
    }
  } while ((uVar1 != 0) && (bVar5 = n - 1 != lVar4, lVar4 = lVar4 + 1, bVar5));
  return 0;
}

Assistant:

int OPENSSL_strncasecmp(const char *a, const char *b, size_t n) {
  for (size_t i = 0; i < n; i++) {
    const int aa = OPENSSL_tolower(a[i]);
    const int bb = OPENSSL_tolower(b[i]);

    if (aa < bb) {
      return -1;
    } else if (aa > bb) {
      return 1;
    } else if (aa == 0) {
      return 0;
    }
  }

  return 0;
}